

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

statement_ptr __thiscall mjs::parser::make_statement<mjs::debugger_statement>(parser *this)

{
  debugger_statement *this_00;
  long in_RSI;
  source_extend local_38;
  undefined1 local_19;
  parser *this_local;
  statement_ptr *s;
  
  this_local = this;
  if (*(long *)(in_RSI + 0x70) == 0) {
    __assert_fail("statement_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x147,
                  "statement_ptr mjs::parser::make_statement(Args &&...) [T = mjs::debugger_statement, Args = <>]"
                 );
  }
  local_19 = 0;
  this_00 = (debugger_statement *)operator_new(0x20);
  position_stack_node::extend(&local_38,*(position_stack_node **)(in_RSI + 0x70));
  debugger_statement::debugger_statement(this_00,&local_38);
  std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>::
  unique_ptr<std::default_delete<mjs::statement>,void>
            ((unique_ptr<mjs::statement,std::default_delete<mjs::statement>> *)this,(pointer)this_00
            );
  source_extend::~source_extend(&local_38);
  return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
         (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
}

Assistant:

statement_ptr make_statement(Args&&... args) {
        assert(statement_pos_);
        auto s = statement_ptr{new T{statement_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << s->extend() << " Producting: " << *s << "\n";
#endif
        return s;
    }